

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
* makePalsAsSpecified(tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                      *__return_storage_ptr__,
                     vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  ProtoPalette *this;
  Rgba *pRVar1;
  FILE *__stream;
  pointer paVar2;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *pvVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  pointer pPVar7;
  const_iterator pvVar8;
  const_iterator pvVar9;
  undefined4 extraout_var;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  *extraout_RAX;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  *extraout_RAX_00;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  *extraout_RAX_01;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  *ptVar10;
  const_iterator pvVar11;
  char *pcVar12;
  Palette *pal;
  Rgba *this_00;
  long lVar13;
  Palette *this_01;
  ulong uVar14;
  ulong uVar15;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> __it;
  pointer pPVar16;
  __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_> __it_00;
  long lVar17;
  undefined1 *puVar18;
  Rgba *pRVar19;
  vector<Palette,_std::allocator<Palette>_> palettes;
  DefaultInitVec<size_t> mappings;
  ProtoPalette *local_88;
  vector<Palette,_std::allocator<Palette>_> local_80;
  ulong local_68;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *local_60;
  Palette *local_58;
  vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
  *local_38;
  
  local_60 = protoPalettes;
  local_38 = (_Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
              *)__return_storage_ptr__;
  std::vector<Palette,_std::allocator<Palette>_>::vector
            (&local_80,
             (long)options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_50);
  paVar2 = options.palSpec.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar15 = (ulong)options.nbColorsPerPal;
    pPVar16 = local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar19 = (options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->_M_elems;
    do {
      if ((char)uVar15 == '\0') {
        uVar15 = 0;
      }
      else if (0xef < pRVar19->alpha) {
        uVar14 = 1;
        this_00 = pRVar19;
        do {
          uVar5 = Rgba::cgbColor(this_00);
          (pPVar16->colors)._M_elems[uVar14 - 1] = uVar5;
          uVar15 = (ulong)options.nbColorsPerPal;
          if (uVar15 <= uVar14) break;
          uVar14 = uVar14 + 1;
          pRVar1 = this_00 + 1;
          this_00 = this_00 + 1;
        } while (0xef < pRVar1->alpha);
      }
      pRVar19 = pRVar19 + 4;
      pPVar16 = pPVar16 + 1;
    } while (pRVar19 != paVar2->_M_elems);
  }
  pvVar3 = local_60;
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector(&local_50,
           (long)(local_60->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(local_60->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_88);
  pPVar7 = (pvVar3->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar3->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar7) {
    local_68 = 0;
    uVar15 = 0;
    do {
      this = pPVar7 + uVar15;
      local_58 = local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      lVar13 = (long)local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                     super__Vector_impl_data._M_start;
      __it_00._M_current =
           local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_88 = this;
      if (0 < lVar13 >> 5) {
        lVar17 = (lVar13 >> 5) + 1;
        do {
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00);
          __it._M_current = __it_00._M_current;
          if (bVar4) goto LAB_0010de25;
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00._M_current + 1);
          __it._M_current = __it_00._M_current + 1;
          if (bVar4) goto LAB_0010de25;
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00._M_current + 2);
          __it._M_current = __it_00._M_current + 2;
          if (bVar4) goto LAB_0010de25;
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it_00._M_current + 3);
          __it._M_current = __it_00._M_current + 3;
          if (bVar4) goto LAB_0010de25;
          __it_00._M_current = __it_00._M_current + 4;
          lVar17 = lVar17 + -1;
          lVar13 = lVar13 + -0x20;
        } while (1 < lVar17);
      }
      lVar13 = lVar13 >> 3;
      if (lVar13 == 1) {
LAB_0010de0d:
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                              *)&local_88,__it_00);
        __it._M_current = local_58;
        if (bVar4) {
          __it._M_current = __it_00._M_current;
        }
      }
      else {
        __it._M_current = __it_00._M_current;
        if (lVar13 == 2) {
LAB_0010dde0:
          bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                  ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                *)&local_88,__it);
          if (!bVar4) {
            __it_00._M_current = __it._M_current + 1;
            goto LAB_0010de0d;
          }
        }
        else {
          __it._M_current = local_58;
          if ((lVar13 == 3) &&
             (bVar4 = __gnu_cxx::__ops::
                      _Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                      ::operator()((_Iter_pred<makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::__0>
                                    *)&local_88,__it_00), __it._M_current = __it_00._M_current,
             !bVar4)) {
            __it._M_current = __it_00._M_current + 1;
            goto LAB_0010dde0;
          }
        }
      }
LAB_0010de25:
      if (__it._M_current ==
          local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar4 = ProtoPalette::empty(this);
        if (bVar4) {
          __assert_fail("!protoPal.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x260,"makePalsAsSpecified");
        }
        pvVar8 = ProtoPalette::begin(this);
        pvVar9 = ProtoPalette::end(this);
        pvVar11 = pvVar9;
        if (pvVar8 != pvVar9) {
          puVar18 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
                    ::$_1::operator()<ProtoPalette>(ProtoPalette_const&)::buf;
          do {
            iVar6 = sprintf(puVar18,", $%04x",(ulong)*pvVar8);
            pvVar11 = (const_iterator)CONCAT44(extraout_var,iVar6);
            puVar18 = puVar18 + 7;
            pvVar8 = pvVar8 + 1;
          } while (pvVar8 != pvVar9);
        }
        local_68 = CONCAT71((int7)((ulong)pvVar11 >> 8),1);
        error("Could not fit tile colors [%s] in specified palettes",0x11f522);
      }
      local_50.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15] =
           (long)__it._M_current -
           (long)local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
      uVar15 = uVar15 + 1;
      pPVar7 = (local_60->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(local_60->
                                    super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >> 3))
    ;
    if ((local_68 & 1) != 0) {
      pcVar12 = "s were";
      if ((long)local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        pcVar12 = " was";
      }
      fprintf(_stderr,"note: The following palette%s specified:\n",pcVar12);
      __stream = _stderr;
      for (this_01 = local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                     super__Vector_impl_data._M_start; _stderr = __stream,
          this_01 !=
          local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
          super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
        pvVar11 = Palette::begin(this_01);
        pvVar8 = Palette::end(this_01);
        if (pvVar11 != pvVar8) {
          puVar18 = makePalsAsSpecified(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)
                    ::$_1::operator()<Palette>(Palette_const&)::buf;
          do {
            sprintf(puVar18,", $%04x",(ulong)*pvVar11);
            puVar18 = puVar18 + 7;
            pvVar11 = pvVar11 + 1;
          } while (pvVar11 != pvVar8);
        }
        fprintf(__stream,"        [%s]\n",0x11f542);
        __stream = _stderr;
      }
      giveUp();
    }
  }
  std::
  _Tuple_impl<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,std::vector<Palette,std::allocator<Palette>>>
  ::
  _Tuple_impl<std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>&,std::vector<Palette,std::allocator<Palette>>&,void>
            (local_38,&local_50,&local_80);
  ptVar10 = extraout_RAX;
  if (local_50.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ptVar10 = extraout_RAX_00;
  }
  if (local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.super__Vector_impl_data
      ._M_start != (Palette *)0x0) {
    operator_delete(local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                          super__Vector_impl_data._M_start);
    ptVar10 = extraout_RAX_01;
  }
  return ptVar10;
}

Assistant:

static std::tuple<DefaultInitVec<size_t>, std::vector<Palette>>
    makePalsAsSpecified(std::vector<ProtoPalette> const &protoPalettes) {
	// Convert the palette spec to actual palettes
	std::vector<Palette> palettes(options.palSpec.size());
	for (auto [spec, pal] : zip(options.palSpec, palettes)) {
		for (size_t i = 0; i < options.nbColorsPerPal && spec[i].isOpaque(); ++i) {
			pal[i] = spec[i].cgbColor();
		}
	}

	auto listColors = [](auto const &list) {
		static char buf[sizeof(", $XXXX, $XXXX, $XXXX, $XXXX")];
		char *ptr = buf;
		for (uint16_t cgbColor : list) {
			sprintf(ptr, ", $%04x", cgbColor);
			ptr += 7;
		}
		return &buf[2];
	};

	// Iterate through proto-palettes, and try mapping them to the specified palettes
	DefaultInitVec<size_t> mappings(protoPalettes.size());
	bool bad = false;
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		ProtoPalette const &protoPal = protoPalettes[i];
		// Find the palette...
		auto iter = std::find_if(palettes.begin(), palettes.end(), [&protoPal](Palette const &pal) {
			// ...which contains all colors in this proto-pal
			return std::all_of(protoPal.begin(), protoPal.end(), [&pal](uint16_t color) {
				return std::find(pal.begin(), pal.end(), color) != pal.end();
			});
		});

		if (iter == palettes.end()) {
			assert(!protoPal.empty());
			error("Could not fit tile colors [%s] in specified palettes", listColors(protoPal));
			bad = true;
		}
		mappings[i] = iter - palettes.begin(); // Bogus value, but whatever
	}
	if (bad) {
		fprintf(stderr, "note: The following palette%s specified:\n",
		        palettes.size() == 1 ? " was" : "s were");
		for (Palette const &pal : palettes) {
			fprintf(stderr, "        [%s]\n", listColors(pal));
		}
		giveUp();
	}

	return {mappings, palettes};
}